

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O2

void __thiscall
bidirectional::BiDirectional::getMinimumWeights(BiDirectional *this,double *fwd_min,double *bwd_min)

{
  double dVar1;
  DiGraph *pDVar2;
  Search *pSVar3;
  double *pdVar4;
  _Rb_tree_node_base *p_Var5;
  double local_38;
  
  *fwd_min = INFINITY;
  pDVar2 = (this->graph_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
           .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl;
  pSVar3 = (this->fwd_search_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
           .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
  p_Var5 = *(_Base_ptr *)((long)&(pSVar3->visited_vertices)._M_t + 0x18);
  local_38 = INFINITY;
  for (; p_Var5 != (_Rb_tree_node_base *)((long)&(pSVar3->visited_vertices)._M_t + 8U);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if (((p_Var5[1]._M_color != (pDVar2->source).lemon_id) &&
        (pdVar4 = *(double **)
                   (*(long *)&(pSVar3->best_labels).
                              super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                              ._M_impl + (long)(int)p_Var5[1]._M_color * 0x10),
        pdVar4 != (double *)0x0)) && (dVar1 = *pdVar4, dVar1 < local_38)) {
      *fwd_min = dVar1;
      local_38 = dVar1;
    }
  }
  *bwd_min = INFINITY;
  pDVar2 = (this->graph_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
           .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl;
  pSVar3 = (this->bwd_search_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
           .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
  p_Var5 = *(_Base_ptr *)((long)&(pSVar3->visited_vertices)._M_t + 0x18);
  local_38 = INFINITY;
  for (; p_Var5 != (_Rb_tree_node_base *)((long)&(pSVar3->visited_vertices)._M_t + 8U);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if (((p_Var5[1]._M_color != (pDVar2->sink).lemon_id) &&
        (pdVar4 = *(double **)
                   (*(long *)&(pSVar3->best_labels).
                              super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                              ._M_impl + (long)(int)p_Var5[1]._M_color * 0x10),
        pdVar4 != (double *)0x0)) && (dVar1 = *pdVar4, dVar1 < local_38)) {
      *bwd_min = dVar1;
      local_38 = dVar1;
    }
  }
  return;
}

Assistant:

void BiDirectional::getMinimumWeights(double* fwd_min, double* bwd_min) {
  // Forward
  // init
  *fwd_min = std::numeric_limits<double>::infinity();
  for (const int& n : fwd_search_ptr_->visited_vertices) {
    if (n != graph_ptr_->source.lemon_id && fwd_search_ptr_->best_labels[n] &&
        fwd_search_ptr_->best_labels[n]->weight < *fwd_min) {
      *fwd_min = fwd_search_ptr_->best_labels[n]->weight;
    }
  }
  // backward
  *bwd_min = std::numeric_limits<double>::infinity();
  for (const int& n : bwd_search_ptr_->visited_vertices) {
    if (n != graph_ptr_->sink.lemon_id && bwd_search_ptr_->best_labels[n] &&
        bwd_search_ptr_->best_labels[n]->weight < *bwd_min) {
      *bwd_min = bwd_search_ptr_->best_labels[n]->weight;
    }
  }
}